

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O3

ze_result_t
driver::zeContextCreateEx
          (ze_driver_handle_t hDriver,ze_context_desc_t *desc,uint32_t numDevices,
          ze_device_handle_t *phDevices,ze_context_handle_t *phContext)

{
  ze_result_t zVar1;
  
  if (DAT_0010e2b0 != (code *)0x0) {
    zVar1 = (*DAT_0010e2b0)();
    return zVar1;
  }
  context_t::get()::count = (ze_context_handle_t)((long)context_t::get()::count + 1);
  *phContext = context_t::get()::count;
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeContextCreateEx(
        ze_driver_handle_t hDriver,                     ///< [in] handle of the driver object
        const ze_context_desc_t* desc,                  ///< [in] pointer to context descriptor
        uint32_t numDevices,                            ///< [in][optional] number of device handles; must be 0 if `nullptr ==
                                                        ///< phDevices`
        ze_device_handle_t* phDevices,                  ///< [in][optional][range(0, numDevices)] array of device handles which
                                                        ///< context has visibility.
                                                        ///< if nullptr, then all devices and any sub-devices supported by the
                                                        ///< driver instance are
                                                        ///< visible to the context.
                                                        ///< otherwise, the context only has visibility to the devices and any
                                                        ///< sub-devices of the
                                                        ///< devices in this array.
        ze_context_handle_t* phContext                  ///< [out] pointer to handle of context object created
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnCreateEx = context.zeDdiTable.Context.pfnCreateEx;
        if( nullptr != pfnCreateEx )
        {
            result = pfnCreateEx( hDriver, desc, numDevices, phDevices, phContext );
        }
        else
        {
            // generic implementation
            *phContext = reinterpret_cast<ze_context_handle_t>( context.get() );

        }

        return result;
    }